

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall wabt::interp::Thread::DoCall(Thread *this,Ptr *func,Ptr *out_trap)

{
  HostFunc *func_00;
  RunResult RVar1;
  int iVar2;
  DefinedFunc *func_01;
  allocator_type local_59;
  Values params;
  Values results;
  
  func_00 = (HostFunc *)func->obj_;
  if ((func_00 == (HostFunc *)0x0) ||
     ((func_00->super_Func).super_Extern.super_Object.kind_ != HostFunc)) {
    func_01 = cast<wabt::interp::DefinedFunc,wabt::interp::Func>((Func *)func_00);
    PushCall(this,func_01,out_trap);
LAB_0015070c:
    RVar1 = Ok;
  }
  else {
    params.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    params.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    params.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    PopValues(this,&(func_00->super_Func).type_.params,&params);
    RVar1 = PushCall(this,func_00,out_trap);
    if (RVar1 != Trap) {
      std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::vector
                (&results,(long)(func_00->super_Func).type_.results.
                                super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)(func_00->super_Func).type_.results.
                                super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                                super__Vector_impl_data._M_start >> 3,&local_59);
      iVar2 = (*(func_00->super_Func).super_Extern.super_Object._vptr_Object[5])
                        (func_00,this,&params,&results,out_trap);
      if (iVar2 != 1) {
        PopCall(this);
        PushValues(this,&(func_00->super_Func).type_.results,
                   (Values *)
                   &results.
                    super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>);
        std::_Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~_Vector_base
                  (&results.
                    super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>);
        std::_Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~_Vector_base
                  (&params.
                    super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>);
        goto LAB_0015070c;
      }
      std::_Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~_Vector_base
                (&results.
                  super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>);
    }
    std::_Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~_Vector_base
              (&params.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
              );
    RVar1 = Trap;
  }
  return RVar1;
}

Assistant:

RunResult Thread::DoCall(const Func::Ptr& func, Trap::Ptr* out_trap) {
  if (auto* host_func = dyn_cast<HostFunc>(func.get())) {
    auto& func_type = host_func->type();

    Values params;
    PopValues(func_type.params, &params);
    if (PushCall(*host_func, out_trap) == RunResult::Trap) {
      return RunResult::Trap;
    }

    Values results(func_type.results.size());
    if (Failed(host_func->Call(*this, params, results, out_trap))) {
      return RunResult::Trap;
    }

    PopCall();
    PushValues(func_type.results, results);
  } else {
    if (PushCall(*cast<DefinedFunc>(func.get()), out_trap) == RunResult::Trap) {
      return RunResult::Ok;
    }
  }
  return RunResult::Ok;
}